

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_unitsEqualAllTestedConditionsVariant2_Test::TestBody
          (Equality_unitsEqualAllTestedConditionsVariant2_Test *this)

{
  shared_ptr *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  ImportSourcePtr is;
  AssertionResult local_98;
  long local_88 [2];
  long *local_78;
  AssertHelper local_70 [8];
  long *local_68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  long local_58 [2];
  shared_ptr *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  shared_ptr *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  local_98._0_8_ = (string *)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"unitsA","");
  libcellml::Units::create((string *)&local_38);
  if ((string *)local_98._0_8_ != (string *)local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  local_98._0_8_ = (string *)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"unitsA","");
  libcellml::Units::create((string *)&local_48);
  if ((string *)local_98._0_8_ != (string *)local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  libcellml::ImportSource::create();
  psVar1 = local_38;
  local_98._0_8_ = (string *)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"some_location","");
  libcellml::ImportedEntity::setImportReference((string *)(psVar1 + 0x10));
  if ((string *)local_98._0_8_ != (string *)local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  psVar1 = local_48;
  local_98._0_8_ = (string *)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"some_location","");
  libcellml::ImportedEntity::setImportReference((string *)(psVar1 + 0x10));
  if ((string *)local_98._0_8_ != (string *)local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  psVar1 = local_38;
  local_98._0_8_ = (string *)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ampere","");
  libcellml::Units::setSourceUnits(psVar1,local_28);
  if ((string *)local_98._0_8_ != (string *)local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  psVar1 = local_48;
  local_98._0_8_ = (string *)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"ampere","");
  libcellml::Units::setSourceUnits(psVar1,local_28);
  if ((string *)local_98._0_8_ != (string *)local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  psVar1 = local_38;
  local_98._0_8_ = (string *)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"second","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"unit_id","");
  libcellml::Units::addUnit((string *)psVar1,1.0,(string *)&local_98);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if ((string *)local_98._0_8_ != (string *)local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  psVar1 = local_48;
  local_98._0_8_ = (string *)local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"second","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"unit_id","");
  libcellml::Units::addUnit((string *)psVar1,1.0,(string *)&local_98);
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  if ((string *)local_98._0_8_ != (string *)local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  local_98._0_8_ = local_48;
  local_98.message_.ptr_ = local_40;
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_40->_M_string_length = (int)local_40->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_40->_M_string_length = (int)local_40->_M_string_length + 1;
    }
  }
  cVar2 = libcellml::Entity::equals(local_38);
  local_68 = (long *)CONCAT71(local_68._1_7_,cVar2);
  local_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_98.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar2 == '\0') goto LAB_00114ef2;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.message_.ptr_);
    if (((ulong)local_68 & 1) == 0) {
LAB_00114ef2:
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_98,(char *)&local_68,"u1->equals(u2)","false");
      testing::internal::AssertHelper::AssertHelper
                (local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x108,(char *)local_98._0_8_);
      testing::internal::AssertHelper::operator=(local_70,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(local_70);
      if ((string *)local_98._0_8_ != (string *)local_88) {
        operator_delete((void *)local_98._0_8_,local_88[0] + 1);
      }
      if (((local_78 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
         (local_78 != (long *)0x0)) {
        (**(code **)(*local_78 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_98._0_8_ = local_38;
  local_98.message_.ptr_ = local_30;
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_30->_M_string_length = (int)local_30->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_30->_M_string_length = (int)local_30->_M_string_length + 1;
    }
  }
  cVar2 = libcellml::Entity::equals(local_48);
  local_68 = (long *)CONCAT71(local_68._1_7_,cVar2);
  local_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_98.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar2 != '\0') goto LAB_001150a8;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98.message_.ptr_);
    if (((ulong)local_68 & 1) != 0) goto LAB_001150a8;
  }
  testing::Message::Message((Message *)&local_78);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_98,(char *)&local_68,"u2->equals(u1)","false");
  testing::internal::AssertHelper::AssertHelper
            (local_70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
             ,0x109,(char *)local_98._0_8_);
  testing::internal::AssertHelper::operator=(local_70,(Message *)&local_78);
  testing::internal::AssertHelper::~AssertHelper(local_70);
  if ((string *)local_98._0_8_ != (string *)local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  if (((local_78 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_78 != (long *)0x0)) {
    (**(code **)(*local_78 + 8))();
  }
LAB_001150a8:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40);
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
  }
  return;
}

Assistant:

TEST(Equality, unitsNotEqualByUnitIdOnly)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second");
    u2->addUnit("second");

    u1->setUnitId(0, "UnitsASecond");

    EXPECT_NE(u1, u2);
    EXPECT_FALSE(u1->equals(u2));
    EXPECT_FALSE(u2->equals(u1));
    EXPECT_TRUE(libcellml::Units::equivalent(u1, u2));
}